

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QTimeZonePrivate::Data>::reallocate
          (QMovableArrayOps<QTimeZonePrivate::Data> *this,qsizetype alloc,AllocationOption option)

{
  pair<QTypedArrayData<QTimeZonePrivate::Data>_*,_QTimeZonePrivate::Data_*> pVar1;
  
  pVar1 = QTypedArrayData<QTimeZonePrivate::Data>::reallocateUnaligned
                    ((this->super_QGenericArrayOps<QTimeZonePrivate::Data>).
                     super_QArrayDataPointer<QTimeZonePrivate::Data>.d,
                     (this->super_QGenericArrayOps<QTimeZonePrivate::Data>).
                     super_QArrayDataPointer<QTimeZonePrivate::Data>.ptr,alloc,option);
  if (pVar1.second != (Data *)0x0) {
    (this->super_QGenericArrayOps<QTimeZonePrivate::Data>).
    super_QArrayDataPointer<QTimeZonePrivate::Data>.d = pVar1.first;
    (this->super_QGenericArrayOps<QTimeZonePrivate::Data>).
    super_QArrayDataPointer<QTimeZonePrivate::Data>.ptr = pVar1.second;
    return;
  }
  qBadAlloc();
}

Assistant:

void reallocate(qsizetype alloc, QArrayData::AllocationOption option)
    {
        auto pair = Data::reallocateUnaligned(this->d, this->ptr, alloc, option);
        Q_CHECK_PTR(pair.second);
        Q_ASSERT(pair.first != nullptr);
        this->d = pair.first;
        this->ptr = pair.second;
    }